

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O0

string * __thiscall LinearRegression::generateTestDataEvaluation_abi_cxx11_(LinearRegression *this)

{
  bool bVar1;
  byte bVar2;
  element_type *this_00;
  LinearRegression *this_01;
  long in_RSI;
  LinearRegression *in_RDI;
  string evalFunction;
  Attribute *att_1;
  size_t var_1;
  string prediction;
  string loadFunction;
  string testTuple;
  Attribute *att;
  size_t var;
  string attrConstruct;
  string attributeString;
  undefined7 in_stack_ffffffffffffeeb0;
  byte in_stack_ffffffffffffeeb7;
  Attribute *in_stack_ffffffffffffeeb8;
  undefined7 in_stack_ffffffffffffeec0;
  undefined1 in_stack_ffffffffffffeec7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Attribute *in_stack_ffffffffffffeed8;
  size_t in_stack_ffffffffffffeee0;
  LinearRegression *__rhs_00;
  LinearRegression *in_stack_ffffffffffffeee8;
  LinearRegression *this_02;
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  reference local_ab0;
  Attribute *local_aa0;
  reference local_a98;
  ulong local_a88;
  allocator local_a79;
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  Attribute *local_98;
  LinearRegression *local_90;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator local_31;
  string local_30 [48];
  
  this_02 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  offset_abi_cxx11_(in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::__cxx11::string::~string(local_88);
  local_90 = (LinearRegression *)0x0;
  while( true ) {
    __rhs_00 = local_90;
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1f4ef6);
    this_01 = (LinearRegression *)TreeDecomposition::numberOfAttributes(this_00);
    if (this_01 <= __rhs_00) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f4f26);
    in_stack_ffffffffffffeed8 =
         TreeDecomposition::getAttribute
                   ((TreeDecomposition *)
                    CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                    (size_t)in_stack_ffffffffffffeeb8);
    local_98 = in_stack_ffffffffffffeed8;
    offset_abi_cxx11_(this_01,(size_t)__rhs_00);
    std::operator+((char *)in_stack_ffffffffffffeeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    typeToStr_abi_cxx11_(this_02,(Type)((ulong)in_RDI >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::__cxx11::string::operator+=((string *)&local_68,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    offset_abi_cxx11_(this_01,(size_t)__rhs_00);
    typeToStr_abi_cxx11_(this_02,(Type)((ulong)in_RDI >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeeb8,
                   (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    std::__cxx11::string::operator+=(local_30,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string(local_238);
    local_90 = (LinearRegression *)((long)&(local_90->super_Application)._vptr_Application + 1);
  }
  __rhs = &local_68;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((char *)in_stack_ffffffffffffeeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::__cxx11::string::operator+=((string *)&local_68,local_278);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_478);
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_998);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a78,"",&local_a79);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  for (local_a88 = 0; local_a88 < 100; local_a88 = local_a88 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffeeb8,
               CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    bVar1 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
    bVar2 = bVar1 ^ 0xff;
    std::bitset<100UL>::reference::~reference(&local_a98);
    if ((bVar2 & 1) == 0) {
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1f691c);
      in_stack_ffffffffffffeeb8 =
           TreeDecomposition::getAttribute
                     ((TreeDecomposition *)CONCAT17(bVar2,in_stack_ffffffffffffeec0),
                      (size_t)in_stack_ffffffffffffeeb8);
      local_aa0 = in_stack_ffffffffffffeeb8;
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_ffffffffffffeeb8,
                 CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
      in_stack_ffffffffffffeeb7 =
           std::bitset::reference::operator_cast_to_bool
                     ((reference *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
      std::bitset<100UL>::reference::~reference(&local_ab0);
      if ((in_stack_ffffffffffffeeb7 & 1) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),
                   local_a88);
        std::__cxx11::to_string((unsigned_long)this_01);
        std::operator+((char *)in_stack_ffffffffffffeeb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffeeb8,
                       (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffeeb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffeeb8,
                       (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::__cxx11::string::operator+=(local_a78,local_b50);
        std::__cxx11::string::~string(local_b50);
        std::__cxx11::string::~string(local_b70);
        std::__cxx11::string::~string(local_b90);
        std::__cxx11::string::~string(local_bb0);
        std::__cxx11::string::~string(local_bd0);
      }
      else {
        std::operator+((char *)this_02,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffeeb8,
                       (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffeeb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffeeb8,
                       (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
        std::__cxx11::string::operator+=(local_a78,local_ad0);
        std::__cxx11::string::~string(local_ad0);
        std::__cxx11::string::~string(local_af0);
        std::__cxx11::string::~string(local_b10);
        std::__cxx11::string::~string(local_b30);
      }
    }
  }
  std::__cxx11::string::pop_back();
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  offset_abi_cxx11_(this_01,(size_t)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (char *)CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::__cxx11::string::~string(local_c10);
  std::__cxx11::string::~string(local_10d0);
  std::__cxx11::string::~string(local_c30);
  std::__cxx11::string::~string(local_c50);
  std::__cxx11::string::~string(local_10b0);
  std::__cxx11::string::~string(local_c70);
  std::__cxx11::string::~string(local_c90);
  std::__cxx11::string::~string(local_1090);
  std::__cxx11::string::~string(local_cb0);
  std::__cxx11::string::~string(local_cd0);
  std::__cxx11::string::~string(local_1070);
  std::__cxx11::string::~string(local_cf0);
  std::__cxx11::string::~string(local_d10);
  std::__cxx11::string::~string(local_1050);
  std::__cxx11::string::~string(local_d30);
  std::__cxx11::string::~string(local_d50);
  std::__cxx11::string::~string(local_d70);
  std::__cxx11::string::~string(local_d90);
  std::__cxx11::string::~string(local_1030);
  std::__cxx11::string::~string(local_db0);
  std::__cxx11::string::~string(local_dd0);
  std::__cxx11::string::~string(local_1010);
  std::__cxx11::string::~string(local_df0);
  std::__cxx11::string::~string(local_e10);
  std::__cxx11::string::~string(local_ff0);
  std::__cxx11::string::~string(local_e30);
  std::__cxx11::string::~string(local_e50);
  std::__cxx11::string::~string(local_fd0);
  std::__cxx11::string::~string(local_e70);
  std::__cxx11::string::~string(local_e90);
  std::__cxx11::string::~string(local_fb0);
  std::__cxx11::string::~string(local_eb0);
  std::__cxx11::string::~string(local_ed0);
  std::__cxx11::string::~string(local_f90);
  std::__cxx11::string::~string(local_ef0);
  std::__cxx11::string::~string(local_f10);
  std::__cxx11::string::~string(local_f70);
  std::__cxx11::string::~string(local_f30);
  std::__cxx11::string::~string(local_f50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeed8,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffeeb7,in_stack_ffffffffffffeeb0));
  std::__cxx11::string::~string(local_10f0);
  std::__cxx11::string::~string(local_bf0);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_30);
  return (string *)this_02;
}

Assistant:

std::string LinearRegression::generateTestDataEvaluation()
{
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"test_data.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";
    
    std::string prediction = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        
        if (_categoricalFeatures[var])
            prediction += "params[index_"+att->_name+"[tuple."+att->_name+"]]+";
        else
            prediction += "params["+std::to_string(_parameterIndex[var])+
                "]*tuple."+att->_name+"+";
    }
    prediction.pop_back();
    
    std::string evalFunction = offset(1)+"void evaluateModel()\n"+offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"double diff, error = 0.0;\n"+
        offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"diff = params[0]+"+prediction+";\n"+
        offset(3)+"error += diff * diff;\n"+
        offset(2)+"}\n"+
        offset(2)+"error /= TestDataset.size();\n"+
        offset(2)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}